

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::BasicNonMS<tcu::Vector<float,_4>,_5>::Run
          (BasicNonMS<tcu::Vector<float,_4>,_5> *this)

{
  CallLogWrapper *this_00;
  void *__s;
  long lVar1;
  GLint level;
  GLuint texture;
  GLuint unit;
  GLboolean layered;
  GLenum *pGVar2;
  ulong uVar3;
  value_type_conflict5 *__val;
  GLenum GVar4;
  ImageSizeMachine machine;
  ivec4 res [7];
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  pGVar2 = &DAT_01ae3e20;
  uVar3 = 0;
  do {
    GVar4 = *pGVar2;
    glu::CallLogWrapper::glBindTexture(this_00,GVar4,this->m_texture[uVar3]);
    if (uVar3 == 6) {
      __s = operator_new(0x100);
      memset(__s,0,0x100);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8c2a,this->m_buffer);
      glu::CallLogWrapper::glBufferData(this_00,0x8c2a,0x100,__s,0x88e4);
      glu::CallLogWrapper::glTexBuffer(this_00,0x8c2a,0x8814,this->m_buffer);
      glu::CallLogWrapper::glBindImageTexture(this_00,7,this->m_texture[6],0,'\0',0,35000,0x8814);
      operator_delete(__s,0x100);
      goto switchD_00a223aa_default;
    }
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2800,0x2600);
    switch(uVar3 & 0xffffffff) {
    case 0:
      glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,10,0x8814,0x200,0x80);
      texture = this->m_texture[uVar3];
      unit = 1;
      level = 1;
      goto LAB_00a2240f;
    case 1:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,3,0x8814,8,8,4);
      texture = this->m_texture[uVar3];
      unit = 2;
      level = 0;
      break;
    case 2:
      glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,4,0x8814,0x10,0x10);
      texture = this->m_texture[uVar3];
      unit = 3;
      level = 0;
      layered = '\0';
      GVar4 = 0x88ba;
      goto LAB_00a22523;
    case 3:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,2,0x8814,4,4,0xc);
      texture = this->m_texture[uVar3];
      unit = 4;
      level = 1;
      break;
    case 4:
      glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,1,0x8814,0x10,8);
      texture = this->m_texture[uVar3];
      unit = 5;
      level = 0;
LAB_00a2240f:
      layered = '\0';
      goto LAB_00a22516;
    case 5:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,3,0x8814,0x7f,0x27,0xc);
      texture = this->m_texture[uVar3];
      unit = 6;
      level = 2;
      break;
    default:
      goto switchD_00a223aa_default;
    }
    layered = '\x01';
LAB_00a22516:
    GVar4 = 35000;
LAB_00a22523:
    glu::CallLogWrapper::glBindImageTexture(this_00,unit,texture,level,layered,0,GVar4,0x8814);
switchD_00a223aa_default:
    uVar3 = uVar3 + 1;
    pGVar2 = pGVar2 + 1;
    if (uVar3 == 7) {
      ImageSizeMachine::ImageSizeMachine(&machine);
      res[0].m_data[0] = 0x100;
      res[0].m_data[1] = 0x40;
      res[0].m_data[2] = 0;
      res[0].m_data[3] = 0;
      res[1].m_data[0] = 8;
      res[1].m_data[1] = 8;
      res[1].m_data[2] = 4;
      res[1].m_data[3] = 0;
      res[2].m_data[0] = 0x10;
      res[2].m_data[1] = 0x10;
      res[2].m_data[2] = 0;
      res[2].m_data[3] = 0;
      res[3].m_data[0] = 2;
      res[3].m_data[1] = 2;
      res[3].m_data[2] = 2;
      res[3].m_data[3] = 0;
      res[4].m_data[0] = 0x10;
      res[4].m_data[1] = 8;
      res[4].m_data[2] = 0;
      res[4].m_data[3] = 0;
      res[5].m_data[0] = 0x1f;
      res[5].m_data[1] = 9;
      res[5].m_data[2] = 0xc;
      res[5].m_data[3] = 0;
      res[6].m_data[0] = 0x10;
      res[6].m_data[1] = 0;
      res[6].m_data[2] = 0;
      res[6].m_data[3] = 0;
      lVar1 = gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<float,4>>
                        ((ImageSizeMachine *)&machine,5,false,res,false);
      ImageSizeMachine::~ImageSizeMachine(&machine);
      return lVar1;
    }
  } while( true );
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 8))
			return NOT_SUPPORTED;

		const GLenum target[7] = { GL_TEXTURE_2D,		 GL_TEXTURE_3D,
								   GL_TEXTURE_CUBE_MAP,  GL_TEXTURE_CUBE_MAP_ARRAY,
								   GL_TEXTURE_RECTANGLE, GL_TEXTURE_2D_ARRAY,
								   GL_TEXTURE_BUFFER };
		for (int i = 0; i < 7; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] != GL_TEXTURE_BUFFER)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexStorage2D(target[i], 10, TexInternalFormat<T>(), 512, 128);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 8, 8, 4);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 4, TexInternalFormat<T>(), 16, 16);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 2, TexInternalFormat<T>(), 4, 4, 12);
				glBindImageTexture(4, m_texture[i], 1, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 4)
			{
				glTexStorage2D(target[i], 1, TexInternalFormat<T>(), 16, 8);
				glBindImageTexture(5, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 5)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 127, 39, 12);
				glBindImageTexture(6, m_texture[i], 2, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 6)
			{
				std::vector<GLubyte> data(256);
				glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
				glBufferData(GL_TEXTURE_BUFFER, 256, &data[0], GL_STATIC_DRAW);
				glTexBuffer(GL_TEXTURE_BUFFER, TexInternalFormat<T>(), m_buffer);
				glBindImageTexture(7, m_texture[i], 0, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(256, 64, 0, 0), ivec4(8, 8, 4, 0),   ivec4(16, 16, 0, 0), ivec4(2, 2, 2, 0),
						 ivec4(16, 8, 0, 0),   ivec4(31, 9, 12, 0), ivec4(16, 0, 0, 0) };
		return machine.Run<T>(STAGE, false, res);
	}